

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol_band.c
# Opt level: O0

int main(int argc,char **argv)

{
  SUNMatrix p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  SUNMatrix p_Var10;
  sunrealtype sVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  SUNLinearSolver S;
  long in_RSI;
  int in_EDI;
  SUNContext sunctx;
  sunrealtype *xdata;
  sunrealtype *colj;
  sunindextype kend;
  sunindextype kstart;
  sunindextype k;
  sunindextype j;
  int print_timing;
  N_Vector b;
  N_Vector y;
  N_Vector x;
  SUNMatrix B;
  SUNMatrix A;
  SUNLinearSolver LS;
  sunindextype lband;
  sunindextype uband;
  sunindextype cols;
  int fails;
  sunrealtype in_stack_ffffffffffffff50;
  N_Vector in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  SUNLinearSolver_Type in_stack_ffffffffffffff64;
  long in_stack_ffffffffffffff70;
  sunrealtype in_stack_ffffffffffffff78;
  N_Vector in_stack_ffffffffffffff80;
  N_Vector in_stack_ffffffffffffff88;
  SUNMatrix A_00;
  undefined4 in_stack_ffffffffffffff98;
  uint local_4;
  
  iVar2 = SUNContext_Create(0,&stack0xffffffffffffff60);
  if (iVar2 == 0) {
    if (in_EDI < 5) {
      printf(
            "ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix lband, print timing \n"
            );
      local_4 = 0xffffffff;
    }
    else {
      lVar9 = atol(*(char **)(in_RSI + 8));
      if (lVar9 < 1) {
        printf("ERROR: number of matrix columns must be a positive integer \n");
        local_4 = 0xffffffff;
      }
      else {
        p_Var10 = (SUNMatrix)atol(*(char **)(in_RSI + 0x10));
        if (((long)p_Var10 < 1) || (lVar9 <= (long)p_Var10)) {
          printf(
                "ERROR: matrix upper bandwidth must be a positive integer, less than number of columns \n"
                );
          local_4 = 0xffffffff;
        }
        else {
          sVar11 = (sunrealtype)atol(*(char **)(in_RSI + 0x18));
          if (((long)sVar11 < 1) || (lVar9 <= (long)sVar11)) {
            printf(
                  "ERROR: matrix lower bandwidth must be a positive integer, less than number of columns \n"
                  );
            local_4 = 0xffffffff;
          }
          else {
            iVar2 = atoi(*(char **)(in_RSI + 0x20));
            SetTiming(iVar2);
            printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",lVar9,p_Var10,
                   sVar11);
            uVar12 = SUNBandMatrix(lVar9,p_Var10,sVar11,
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
            uVar13 = SUNBandMatrix(lVar9,p_Var10,sVar11,
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
            uVar14 = N_VNew_Serial(lVar9,CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60));
            uVar15 = N_VNew_Serial(lVar9,CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60));
            uVar16 = N_VNew_Serial(lVar9,CONCAT44(in_stack_ffffffffffffff64,
                                                  in_stack_ffffffffffffff60));
            S = (SUNLinearSolver)N_VGetArrayPointer(uVar14);
            for (A_00 = (SUNMatrix)0x0; (long)A_00 < lVar9;
                A_00 = (SUNMatrix)((long)&A_00->content + 1)) {
              in_stack_ffffffffffffff70 = SUNBandMatrix_Column(uVar12,A_00);
              p_Var1 = p_Var10;
              if ((long)A_00 < (long)p_Var10) {
                p_Var1 = A_00;
              }
              in_stack_ffffffffffffff58 = (N_Vector)-(long)p_Var1;
              in_stack_ffffffffffffff78 = sVar11;
              in_stack_ffffffffffffff80 = in_stack_ffffffffffffff58;
              in_stack_ffffffffffffff88 = in_stack_ffffffffffffff58;
              in_stack_ffffffffffffff50 = sVar11;
              if ((lVar9 + -1) - (long)sVar11 < (long)A_00) {
                in_stack_ffffffffffffff78 = (sunrealtype)((lVar9 + -1) - (long)A_00);
                in_stack_ffffffffffffff50 = in_stack_ffffffffffffff78;
              }
              for (; (long)in_stack_ffffffffffffff88 <= (long)in_stack_ffffffffffffff78;
                  in_stack_ffffffffffffff88 =
                       (N_Vector)((long)&in_stack_ffffffffffffff88->content + 1)) {
                iVar3 = rand();
                *(double *)(in_stack_ffffffffffffff70 + (long)in_stack_ffffffffffffff88 * 8) =
                     (double)iVar3 / 2147483647.0;
              }
              iVar3 = rand();
              (&S->content)[(long)A_00] = (void *)((double)iVar3 / 2147483647.0);
            }
            iVar3 = SUNMatScaleAddI(1.0 / (double)((long)&p_Var10->content + (long)sVar11 + 1),
                                    uVar12);
            if (iVar3 == 0) {
              SUNMatCopy(uVar12,uVar13);
              N_VScale(0x3ff0000000000000,uVar14,uVar15);
              iVar3 = SUNMatMatvec(uVar12,uVar14,uVar16);
              if (iVar3 == 0) {
                lVar9 = SUNLinSol_Band(uVar14,uVar12,
                                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                                      );
                if (lVar9 == 0) {
                  printf("FAIL: SUNLinSol_Band returned NULL\n");
                  SUNMatDestroy(uVar12);
                  SUNMatDestroy(uVar13);
                  N_VDestroy(uVar14);
                  N_VDestroy(uVar15);
                  N_VDestroy(uVar16);
                  local_4 = 1;
                }
                else {
                  iVar3 = Test_SUNLinSolInitialize
                                    ((SUNLinearSolver)in_stack_ffffffffffffff58,
                                     (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
                  iVar4 = Test_SUNLinSolSetup(S,(SUNMatrix)
                                                CONCAT44(in_stack_ffffffffffffff64,
                                                         in_stack_ffffffffffffff60),
                                              (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
                  iVar2 = Test_SUNLinSolSolve((SUNLinearSolver)
                                              CONCAT44(iVar2,in_stack_ffffffffffffff98),A_00,
                                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                              in_stack_ffffffffffffff78,
                                              (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                              (int)in_stack_ffffffffffffff70);
                  iVar5 = Test_SUNLinSolGetType
                                    (S,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
                  iVar6 = Test_SUNLinSolGetID(S,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                  ;
                  iVar7 = Test_SUNLinSolLastFlag(S,in_stack_ffffffffffffff64);
                  iVar8 = Test_SUNLinSolSpace(S,in_stack_ffffffffffffff64);
                  local_4 = iVar8 + iVar7 + iVar6 + iVar5 + iVar2 + iVar4 + iVar3;
                  if (local_4 == 0) {
                    printf("SUCCESS: SUNLinSol module passed all tests \n \n");
                  }
                  else {
                    printf("FAIL: SUNLinSol module failed %i tests \n \n",(ulong)local_4);
                    printf("\nA (original) =\n");
                    SUNBandMatrix_Print(uVar13,_stdout);
                    printf("\nA (factored) =\n");
                    SUNBandMatrix_Print(uVar12,_stdout);
                    printf("\nx (original) =\n");
                    N_VPrint_Serial(uVar15);
                    printf("\nx (computed) =\n");
                    N_VPrint_Serial(uVar14);
                  }
                  SUNLinSolFree(lVar9);
                  SUNMatDestroy(uVar12);
                  SUNMatDestroy(uVar13);
                  N_VDestroy(uVar14);
                  N_VDestroy(uVar15);
                  N_VDestroy(uVar16);
                  SUNContext_Free(&stack0xffffffffffffff60);
                }
              }
              else {
                printf("FAIL: SUNLinSol SUNMatMatvec failure\n");
                SUNMatDestroy(uVar12);
                SUNMatDestroy(uVar13);
                N_VDestroy(uVar14);
                N_VDestroy(uVar15);
                N_VDestroy(uVar16);
                local_4 = 1;
              }
            }
            else {
              printf("FAIL: SUNLinSol SUNMatScaleAddI failure\n");
              SUNMatDestroy(uVar12);
              SUNMatDestroy(uVar13);
              N_VDestroy(uVar14);
              N_VDestroy(uVar15);
              N_VDestroy(uVar16);
              local_4 = 1;
            }
          }
        }
      }
    }
  }
  else {
    printf("ERROR: SUNContext_Create failed\n");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int fails = 0;                   /* counter for test failures  */
  sunindextype cols, uband, lband; /* matrix columns, bandwidths */
  SUNLinearSolver LS;              /* solver object              */
  SUNMatrix A, B;                  /* test matrices              */
  N_Vector x, y, b;                /* test vectors               */
  int print_timing;
  sunindextype j, k, kstart, kend;
  sunrealtype *colj, *xdata;
  SUNContext sunctx;

  if (SUNContext_Create(SUN_COMM_NULL, &sunctx))
  {
    printf("ERROR: SUNContext_Create failed\n");
    return (-1);
  }

  /* check input and set matrix dimensions */
  if (argc < 5)
  {
    printf("ERROR: FOUR (4) Inputs required: matrix cols, matrix uband, matrix "
           "lband, print timing \n");
    return (-1);
  }

  cols = (sunindextype)atol(argv[1]);
  if (cols <= 0)
  {
    printf("ERROR: number of matrix columns must be a positive integer \n");
    return (-1);
  }

  uband = (sunindextype)atol(argv[2]);
  if ((uband <= 0) || (uband >= cols))
  {
    printf("ERROR: matrix upper bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  lband = (sunindextype)atol(argv[3]);
  if ((lband <= 0) || (lband >= cols))
  {
    printf("ERROR: matrix lower bandwidth must be a positive integer, less "
           "than number of columns \n");
    return (-1);
  }

  print_timing = atoi(argv[4]);
  SetTiming(print_timing);

  printf("\nBand linear solver test: size %ld, bandwidths %ld %ld\n\n",
         (long int)cols, (long int)uband, (long int)lband);

  /* Create matrices and vectors */
  A = SUNBandMatrix(cols, uband, lband, sunctx);
  B = SUNBandMatrix(cols, uband, lband, sunctx);
  x = N_VNew_Serial(cols, sunctx);
  y = N_VNew_Serial(cols, sunctx);
  b = N_VNew_Serial(cols, sunctx);

  /* Fill matrix and x vector with uniform random data in [0,1] */
  xdata = N_VGetArrayPointer(x);
  for (j = 0; j < cols; j++)
  {
    /* A matrix column */
    colj   = SUNBandMatrix_Column(A, j);
    kstart = (j < uband) ? -j : -uband;
    kend   = (j > cols - 1 - lband) ? cols - 1 - j : lband;
    for (k = kstart; k <= kend; k++)
    {
      colj[k] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
    }

    /* x entry */
    xdata[j] = (sunrealtype)rand() / (sunrealtype)RAND_MAX;
  }

  /* Scale/shift matrix to ensure diagonal dominance */
  fails += SUNMatScaleAddI(ONE / (uband + lband + 1), A);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatScaleAddI failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* copy A and x into B and y to print in case of solver failure */
  SUNMatCopy(A, B);
  N_VScale(ONE, x, y);

  /* create right-hand side vector for linear solve */
  fails = SUNMatMatvec(A, x, b);
  if (fails)
  {
    printf("FAIL: SUNLinSol SUNMatMatvec failure\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Create banded linear solver */
  LS = SUNLinSol_Band(x, A, sunctx);
  if (LS == NULL)
  {
    printf("FAIL: SUNLinSol_Band returned NULL\n");

    /* Free matrices and vectors */
    SUNMatDestroy(A);
    SUNMatDestroy(B);
    N_VDestroy(x);
    N_VDestroy(y);
    N_VDestroy(b);

    return (1);
  }

  /* Run Tests */
  fails += Test_SUNLinSolInitialize(LS, 0);
  fails += Test_SUNLinSolSetup(LS, A, 0);
  fails += Test_SUNLinSolSolve(LS, A, x, b, 100 * SUN_UNIT_ROUNDOFF, SUNTRUE, 0);

  fails += Test_SUNLinSolGetType(LS, SUNLINEARSOLVER_DIRECT, 0);
  fails += Test_SUNLinSolGetID(LS, SUNLINEARSOLVER_BAND, 0);
  fails += Test_SUNLinSolLastFlag(LS, 0);
  fails += Test_SUNLinSolSpace(LS, 0);

  /* Print result */
  if (fails)
  {
    printf("FAIL: SUNLinSol module failed %i tests \n \n", fails);
    printf("\nA (original) =\n");
    SUNBandMatrix_Print(B, stdout);
    printf("\nA (factored) =\n");
    SUNBandMatrix_Print(A, stdout);
    printf("\nx (original) =\n");
    N_VPrint_Serial(y);
    printf("\nx (computed) =\n");
    N_VPrint_Serial(x);
  }
  else { printf("SUCCESS: SUNLinSol module passed all tests \n \n"); }

  /* Free solver, matrix and vectors */
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNMatDestroy(B);
  N_VDestroy(x);
  N_VDestroy(y);
  N_VDestroy(b);
  SUNContext_Free(&sunctx);

  return (fails);
}